

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O2

void __thiscall
BSA_SpikeDecodingSynapse::initialize
          (BSA_SpikeDecodingSynapse *this,Population *n_from,Population *n_to)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  Clock *pCVar2;
  Logging *pLVar3;
  ValueEvent *this_01;
  ulong uVar4;
  BSA_SpikeDecodingSynapse_param *pBVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  int i;
  int iVar10;
  uint uVar11;
  bool bVar12;
  double dVar13;
  double extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  allocator_type local_a9;
  double local_a8;
  value_type_conflict1 local_a0;
  double local_98;
  double dStack_90;
  _Deque_base<double,_std::allocator<double>_> local_80;
  
  iVar1 = (*n_from->_vptr_Population[3])(n_from);
  this->inputSize = iVar1;
  iVar1 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar1;
  if (this->inputSize == iVar1) {
    (this->super_Synapse).from_population = n_from;
    (this->super_Synapse).to_population = n_to;
    pCVar2 = Clock::getInstance();
    this->clock = pCVar2;
    pLVar3 = Logging::getInstance();
    this->logger = pLVar3;
    for (iVar1 = 0; iVar1 < this->inputSize; iVar1 = iVar1 + 1) {
      this_01 = (ValueEvent *)operator_new(0x20);
      ValueEvent::ValueEvent(this_01);
      local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_01;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_80);
      iVar10 = this->inputSize;
      dVar13 = this->param->filter_length;
      uVar4 = (ulong)dVar13;
      local_a0 = 0.0;
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)&local_80,
                 (long)(dVar13 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,&local_a0,
                 &local_a9);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::_M_fill_assign(&this->input,(long)iVar10,(value_type *)&local_80);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_80);
    }
    pBVar5 = this->param;
    if (pBVar5->window == TRIANGLE) {
      local_a8 = pBVar5->filter_length;
      dVar13 = ceil(local_a8 * 0.5);
      iVar10 = (int)dVar13;
      uVar11 = (uint)local_a8;
      local_98 = (double)(int)dVar13;
      dStack_90 = (double)(int)extraout_XMM0_Qb;
      iVar1 = 0;
      if (0 < iVar10) {
        iVar1 = iVar10;
      }
      this_00 = &this->filter;
      dVar13 = 1.0;
      while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar13 / local_98) * this->param->scale);
        local_a8 = dVar13;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_80);
        dVar13 = local_a8 + 1.0;
      }
      if ((uVar11 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_00,(this->filter).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish + -1);
      }
      while (1 < iVar10) {
        iVar10 = iVar10 + -1;
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)(((double)iVar10 / local_98) * this->param->scale);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_00,(double *)&local_80);
      }
      pBVar5 = this->param;
    }
    else if (pBVar5->window == HAMMING) {
      iVar1 = 0;
      while( true ) {
        if (pBVar5->filter_length <= (double)iVar1) break;
        dVar13 = cos(((double)iVar1 * 6.283185307179586) / (pBVar5->filter_length + -1.0));
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar13 * -0.46 + 0.54) * this->param->scale);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&this->filter,(double *)&local_80);
        iVar1 = iVar1 + 1;
        pBVar5 = this->param;
      }
    }
    lVar8 = (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    lVar9 = lVar8 >> 3;
    auVar14._8_4_ = (int)(lVar8 >> 0x23);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    dVar13 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    if ((pBVar5->filter_length != dVar13) || (NAN(pBVar5->filter_length) || NAN(dVar13))) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter"
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Number of input neurons not equal to number of output neurons");
  std::endl<char,std::char_traits<char>>(poVar6);
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Number of input neurons not equal to number of output neurons";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

void BSA_SpikeDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        input.assign(inputSize, deque<double>(param->filter_length, 0));
    }

    if(param->window == HAMMING) {
        for(int i = 0; i < param->filter_length; i++) {
            filter.push_back((0.54 - 0.46 * cos(6.283185307179586*i/(param->filter_length-1))) * param->scale);
        }
    }
    else if(param->window == TRIANGLE) {
        int middle = ceil(param->filter_length/2.0);
        int len = param->filter_length;
        bool isEven = len % 2 == 0;
        for(int i = 1; i <= middle; i++) {
            filter.push_back((i) / (double)middle * param->scale);
        }
        if(isEven) {
            filter.push_back(filter.back());
        }
        for(int i = middle; i > 1; i--) {
            filter.push_back((i-1) / (double)middle * param->scale);
        }
    }
    if(filter.size() != param->filter_length) {
        cout << "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter" << endl;
    }
    // filter = vector<double>{0.05942473828591342,0.07318223830709897,0.11232230333947553,0.17484795255681723,0.25675440297792484,0.3523237031416342,0.454573094246691,0.5558198517560227,0.6483143637949771,0.724886509451,0.7795486730754763,0.8080021690669681,0.8080021690669681,0.7795486730754763,0.724886509451,0.6483143637949771,0.5558198517560227,0.45457309424669107,0.3523237031416343,0.256754402977925,0.17484795255681737,0.11232230333947553,0.07318223830709897,0.05942473828591342};
    // filter = vector<double>{0.0,0.030303030303030304,0.06060606060606061,0.0909090909090909,0.12121212121212122,0.15151515151515152,0.1818181818181818,0.21212121212121213,0.24242424242424243,0.27272727272727276,0.30303030303030304,0.27272727272727276,0.24242424242424243,0.21212121212121213,0.1818181818181818,0.15151515151515152,0.12121212121212122,0.0909090909090909,0.06060606060606061,0.030303030303030304,0.0};
    for(int i = 0; i < param->filter_length; i++) {
        // TODO add
        // filter.push_back(0.5);
    }
}